

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

QVariantHash __thiscall QAuthenticator::options(QAuthenticator *this)

{
  Data *pDVar1;
  Data *in_RDI;
  
  if (this->d == (QAuthenticatorPrivate *)0x0) {
    *(long *)in_RDI = 0;
  }
  else {
    pDVar1 = (this->d->options).d;
    *(Data **)in_RDI = pDVar1;
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return (QVariantHash)in_RDI;
    }
  }
  return (QVariantHash)in_RDI;
}

Assistant:

QVariantHash QAuthenticator::options() const
{
    return d ? d->options : QVariantHash();
}